

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O2

void __thiscall QWidgetLineControl::moveCursor(QWidgetLineControl *this,int pos,bool mark)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  
  commitPreedit(this);
  if ((*(int *)(this + 0x40) != pos) &&
     (this[0x50] = (QWidgetLineControl)((byte)this[0x50] | 2), *(long *)(this + 0xe8) != 0)) {
    if (*(int *)(this + 0x40) < pos) {
      pos = nextMaskBlank(this,pos);
    }
    else {
      pos = prevMaskBlank(this,pos);
    }
  }
  if (mark) {
    iVar5 = *(int *)(this + 0x114);
    iVar1 = *(int *)(this + 0x40);
    iVar2 = *(int *)(this + 0x110);
    iVar3 = iVar1;
    if (iVar1 == iVar5) {
      iVar3 = iVar2;
    }
    if (iVar5 <= iVar2) {
      iVar3 = iVar1;
    }
    iVar6 = iVar3;
    if (iVar1 == iVar2) {
      iVar6 = iVar5;
    }
    if (iVar5 <= iVar2) {
      iVar6 = iVar3;
    }
    iVar5 = pos;
    if (iVar6 < pos) {
      iVar5 = iVar6;
    }
    *(int *)(this + 0x110) = iVar5;
    if (iVar6 <= pos) {
      iVar6 = pos;
    }
    *(int *)(this + 0x114) = iVar6;
    updateDisplayText(this,false);
    *(int *)(this + 0x40) = pos;
    uVar4 = *(ushort *)(this + 0x50);
  }
  else {
    internalDeselect(this);
    *(int *)(this + 0x40) = pos;
    uVar4 = *(ushort *)(this + 0x50);
    if (-1 < (char)uVar4) goto LAB_003f6a9a;
  }
  *(ushort *)(this + 0x50) = uVar4 & 0xff7f;
  selectionChanged(this);
LAB_003f6a9a:
  emitCursorPositionChanged(this);
  return;
}

Assistant:

void QWidgetLineControl::moveCursor(int pos, bool mark)
{
    commitPreedit();

    if (pos != m_cursor) {
        separate();
        if (m_maskData)
            pos = pos > m_cursor ? nextMaskBlank(pos) : prevMaskBlank(pos);
    }
    if (mark) {
        int anchor;
        if (m_selend > m_selstart && m_cursor == m_selstart)
            anchor = m_selend;
        else if (m_selend > m_selstart && m_cursor == m_selend)
            anchor = m_selstart;
        else
            anchor = m_cursor;
        m_selstart = qMin(anchor, pos);
        m_selend = qMax(anchor, pos);
        updateDisplayText();
    } else {
        internalDeselect();
    }
    m_cursor = pos;
    if (mark || m_selDirty) {
        m_selDirty = false;
        emit selectionChanged();
    }
    emitCursorPositionChanged();
}